

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

double orient4dadapt(double *pa,double *pb,double *pc,double *pd,double *pe,double aheight,
                    double bheight,double cheight,double dheight,double eheight,double permanent)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int elen;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double ac [4];
  double da [4];
  double ab [4];
  double bd [4];
  double cd [4];
  double bc [4];
  double temp8b [8];
  double temp16 [16];
  double temp8c [8];
  double temp8a [8];
  double temp24 [24];
  double cdet [48];
  double bdet [48];
  double adet [48];
  double ddet [48];
  double fin1 [192];
  double cddet [96];
  double abdet [96];
  double local_1588;
  double local_1578;
  double local_14f8;
  double local_14f0;
  double local_14e8;
  double local_14e0;
  double local_14d8;
  double local_14d0;
  double local_14c8;
  double local_14c0;
  double local_14b8;
  double local_14b0;
  double local_14a8;
  double local_14a0;
  double local_1498;
  double local_1490;
  double local_1488;
  double local_1480;
  double local_1478;
  double local_1470;
  double local_1468;
  double local_1460;
  double local_1458;
  double local_1450;
  double local_1448;
  double local_1440;
  double local_1438 [8];
  double local_13f8 [16];
  double local_1378 [8];
  double local_1338 [8];
  double local_12f8 [24];
  double local_1238 [48];
  double local_10b8 [48];
  double local_f38 [48];
  double local_db8 [48];
  double local_c38 [192];
  double local_638 [96];
  double local_338 [97];
  
  dVar1 = *pa;
  dVar54 = *pe;
  dVar35 = pe[1];
  dVar36 = dVar1 - dVar54;
  dVar17 = pb[1];
  dVar2 = dVar17 - dVar35;
  dVar14 = dVar36 * splitter - (dVar36 * splitter - dVar36);
  dVar22 = dVar2 * splitter - (dVar2 * splitter - dVar2);
  dVar39 = dVar36 * dVar2;
  dVar37 = dVar36 - dVar14;
  dVar19 = dVar2 - dVar22;
  dVar20 = dVar37 * dVar19 - (((dVar39 - dVar14 * dVar22) - dVar37 * dVar22) - dVar14 * dVar19);
  dVar18 = *pb;
  dVar43 = dVar18 - dVar54;
  dVar51 = dVar43 * splitter - (dVar43 * splitter - dVar43);
  dVar16 = pa[1];
  dVar29 = dVar16 - dVar35;
  dVar23 = dVar29 * splitter - (dVar29 * splitter - dVar29);
  dVar25 = dVar43 * dVar29;
  dVar44 = dVar43 - dVar51;
  dVar30 = dVar29 - dVar23;
  dVar42 = pc[1];
  dVar3 = dVar42 - dVar35;
  dVar24 = dVar3 * splitter - (dVar3 * splitter - dVar3);
  dVar34 = *pc;
  dVar4 = dVar34 - dVar54;
  dVar31 = dVar4 * splitter - (dVar4 * splitter - dVar4);
  dVar53 = pd[1];
  dVar33 = dVar53 - dVar35;
  dVar15 = dVar33 * splitter - (dVar33 * splitter - dVar33);
  dVar21 = *pd;
  dVar26 = dVar21 - dVar54;
  dVar48 = splitter * dVar26 - (splitter * dVar26 - dVar26);
  dVar49 = dVar3 - dVar24;
  dVar27 = dVar26 - dVar48;
  dVar38 = dVar4 - dVar31;
  dVar32 = dVar33 - dVar15;
  dVar12 = dVar44 * dVar30 - (((dVar25 - dVar51 * dVar23) - dVar44 * dVar23) - dVar51 * dVar30);
  dVar45 = dVar20 - dVar12;
  local_14b8 = (dVar20 - (dVar45 + (dVar20 - dVar45))) + ((dVar20 - dVar45) - dVar12);
  dVar20 = pa[2];
  dVar12 = pe[2];
  dVar47 = pb[2];
  dVar50 = pc[2];
  dVar28 = pd[2];
  dVar13 = dVar39 + dVar45;
  dVar45 = (dVar39 - (dVar13 - (dVar13 - dVar39))) + (dVar45 - (dVar13 - dVar39));
  dVar39 = dVar45 - dVar25;
  local_14b0 = (dVar45 - (dVar39 + (dVar45 - dVar39))) + ((dVar45 - dVar39) - dVar25);
  dVar40 = dVar13 + dVar39;
  local_14a8 = (dVar13 - (dVar40 - (dVar40 - dVar13))) + (dVar39 - (dVar40 - dVar13));
  dVar45 = dVar43 * dVar3;
  dVar25 = dVar44 * dVar49 - (((dVar45 - dVar51 * dVar24) - dVar44 * dVar24) - dVar51 * dVar49);
  dVar46 = dVar4 * dVar2;
  dVar13 = dVar38 * dVar19 - (((dVar46 - dVar31 * dVar22) - dVar38 * dVar22) - dVar31 * dVar19);
  dVar39 = dVar25 - dVar13;
  local_1458 = (dVar25 - (dVar39 + (dVar25 - dVar39))) + ((dVar25 - dVar39) - dVar13);
  dVar13 = dVar45 + dVar39;
  dVar25 = (dVar45 - (dVar13 - (dVar13 - dVar45))) + (dVar39 - (dVar13 - dVar45));
  dVar39 = dVar25 - dVar46;
  local_1450 = (dVar25 - (dVar39 + (dVar25 - dVar39))) + ((dVar25 - dVar39) - dVar46);
  dVar46 = dVar13 + dVar39;
  local_1448 = (dVar13 - (dVar46 - (dVar46 - dVar13))) + (dVar39 - (dVar46 - dVar13));
  dVar13 = dVar4 * dVar33;
  dVar52 = dVar38 * dVar32 - (((dVar13 - dVar31 * dVar15) - dVar38 * dVar15) - dVar31 * dVar32);
  dVar45 = dVar26 * dVar3;
  dVar25 = dVar27 * dVar49 - (((dVar45 - dVar48 * dVar24) - dVar27 * dVar24) - dVar48 * dVar49);
  dVar39 = dVar52 - dVar25;
  local_1478 = (dVar52 - (dVar39 + (dVar52 - dVar39))) + ((dVar52 - dVar39) - dVar25);
  dVar25 = dVar13 + dVar39;
  dVar13 = (dVar13 - (dVar25 - (dVar25 - dVar13))) + (dVar39 - (dVar25 - dVar13));
  dVar39 = dVar13 - dVar45;
  local_1470 = (dVar13 - (dVar39 + (dVar13 - dVar39))) + ((dVar13 - dVar39) - dVar45);
  dVar41 = dVar25 + dVar39;
  local_1468 = (dVar25 - (dVar41 - (dVar41 - dVar25))) + (dVar39 - (dVar41 - dVar25));
  dVar13 = dVar26 * dVar29;
  dVar39 = dVar27 * dVar30 - (((dVar13 - dVar48 * dVar23) - dVar27 * dVar23) - dVar48 * dVar30);
  dVar52 = dVar36 * dVar33;
  dVar45 = dVar37 * dVar32 - (((dVar52 - dVar14 * dVar15) - dVar37 * dVar15) - dVar14 * dVar32);
  dVar25 = dVar39 - dVar45;
  local_14d8 = (dVar39 - (dVar25 + (dVar39 - dVar25))) + ((dVar39 - dVar25) - dVar45);
  dVar39 = dVar13 + dVar25;
  dVar13 = (dVar13 - (dVar39 - (dVar39 - dVar13))) + (dVar25 - (dVar39 - dVar13));
  dVar25 = dVar13 - dVar52;
  local_14d0 = (dVar13 - (dVar25 + (dVar13 - dVar25))) + ((dVar13 - dVar25) - dVar52);
  dVar52 = dVar39 + dVar25;
  local_14c8 = (dVar39 - (dVar52 - (dVar52 - dVar39))) + (dVar25 - (dVar52 - dVar39));
  dVar13 = dVar36 * dVar3;
  dVar45 = dVar49 * dVar37 - (((dVar13 - dVar14 * dVar24) - dVar24 * dVar37) - dVar14 * dVar49);
  dVar25 = dVar4 * dVar29;
  dVar14 = dVar38 * dVar30 - (((dVar25 - dVar31 * dVar23) - dVar23 * dVar38) - dVar31 * dVar30);
  dVar39 = dVar45 - dVar14;
  local_14f8 = (dVar45 - (dVar39 + (dVar45 - dVar39))) + ((dVar45 - dVar39) - dVar14);
  dVar14 = dVar13 + dVar39;
  dVar13 = (dVar13 - (dVar14 - (dVar14 - dVar13))) + (dVar39 - (dVar14 - dVar13));
  dVar39 = dVar13 - dVar25;
  local_14f0 = (dVar13 - (dVar39 + (dVar13 - dVar39))) + ((dVar13 - dVar39) - dVar25);
  dVar24 = dVar14 + dVar39;
  local_14e8 = (dVar14 - (dVar24 - (dVar24 - dVar14))) + (dVar39 - (dVar24 - dVar14));
  dVar13 = dVar43 * dVar33;
  dVar25 = dVar32 * dVar44 - (((dVar13 - dVar51 * dVar15) - dVar15 * dVar44) - dVar51 * dVar32);
  dVar14 = dVar26 * dVar2;
  dVar39 = dVar27 * dVar19 - (((dVar14 - dVar48 * dVar22) - dVar22 * dVar27) - dVar48 * dVar19);
  dVar15 = dVar25 - dVar39;
  local_1498 = (dVar25 - (dVar15 + (dVar25 - dVar15))) + ((dVar25 - dVar15) - dVar39);
  dVar39 = dVar13 + dVar15;
  dVar13 = (dVar13 - (dVar39 - (dVar39 - dVar13))) + (dVar15 - (dVar39 - dVar13));
  dVar15 = dVar13 - dVar14;
  local_1490 = (dVar13 - (dVar15 + (dVar13 - dVar15))) + ((dVar13 - dVar15) - dVar14);
  dVar23 = dVar39 + dVar15;
  local_1488 = (dVar39 - (dVar23 - (dVar23 - dVar39))) + (dVar15 - (dVar23 - dVar39));
  dVar13 = dVar20 - dVar12;
  dVar22 = dVar47 - dVar12;
  dVar39 = dVar50 - dVar12;
  dVar14 = dVar28 - dVar12;
  dVar15 = aheight - eheight;
  dVar25 = bheight - eheight;
  dVar45 = cheight - eheight;
  dVar19 = dheight - eheight;
  local_14e0 = dVar24;
  local_14c0 = dVar52;
  local_14a0 = dVar40;
  local_1480 = dVar23;
  local_1460 = dVar41;
  local_1440 = dVar46;
  iVar5 = scale_expansion_zeroelim(4,&local_1478,dVar22,local_1338);
  local_1578 = -dVar39;
  iVar6 = scale_expansion_zeroelim(4,&local_1498,-dVar39,local_1438);
  iVar7 = scale_expansion_zeroelim(4,&local_1458,dVar14,local_1378);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,local_1338,iVar6,local_1438,local_13f8);
  iVar5 = fast_expansion_sum_zeroelim(iVar7,local_1378,iVar5,local_13f8,local_12f8);
  iVar5 = scale_expansion_zeroelim(iVar5,local_12f8,-dVar15,local_f38);
  iVar6 = scale_expansion_zeroelim(4,&local_14d8,dVar39,local_1338);
  iVar7 = scale_expansion_zeroelim(4,&local_14f8,dVar14,local_1438);
  iVar8 = scale_expansion_zeroelim(4,&local_1478,dVar13,local_1378);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,local_1338,iVar7,local_1438,local_13f8);
  iVar6 = fast_expansion_sum_zeroelim(iVar8,local_1378,iVar6,local_13f8,local_12f8);
  iVar6 = scale_expansion_zeroelim(iVar6,local_12f8,dVar25,local_10b8);
  iVar7 = scale_expansion_zeroelim(4,&local_14b8,dVar14,local_1338);
  iVar8 = scale_expansion_zeroelim(4,&local_1498,dVar13,local_1438);
  iVar9 = scale_expansion_zeroelim(4,&local_14d8,dVar22,local_1378);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,local_1338,iVar8,local_1438,local_13f8);
  iVar7 = fast_expansion_sum_zeroelim(iVar9,local_1378,iVar7,local_13f8,local_12f8);
  iVar7 = scale_expansion_zeroelim(iVar7,local_12f8,-dVar45,local_1238);
  iVar8 = scale_expansion_zeroelim(4,&local_1458,dVar13,local_1338);
  local_1588 = -dVar22;
  iVar9 = scale_expansion_zeroelim(4,&local_14f8,-dVar22,local_1438);
  elen = scale_expansion_zeroelim(4,&local_14b8,dVar39,local_1378);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,local_1338,iVar9,local_1438,local_13f8);
  iVar8 = fast_expansion_sum_zeroelim(elen,local_1378,iVar8,local_13f8,local_12f8);
  iVar8 = scale_expansion_zeroelim(iVar8,local_12f8,dVar19,local_db8);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,local_f38,iVar6,local_10b8,local_338);
  iVar6 = fast_expansion_sum_zeroelim(iVar7,local_1238,iVar8,local_db8,local_638);
  uVar10 = fast_expansion_sum_zeroelim(iVar5,local_338,iVar6,local_638,local_c38);
  if (1 < (int)uVar10) {
    uVar11 = 1;
    do {
      local_c38[0] = local_c38[0] + local_c38[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  if ((local_c38[0] < isperrboundB * permanent) && (-local_c38[0] < isperrboundB * permanent)) {
    dVar27 = (dVar1 - (dVar36 + (dVar1 - dVar36))) + ((dVar1 - dVar36) - dVar54);
    dVar32 = (dVar16 - (dVar29 + (dVar16 - dVar29))) + ((dVar16 - dVar29) - dVar35);
    dVar30 = (dVar20 - (dVar13 + (dVar20 - dVar13))) + ((dVar20 - dVar13) - dVar12);
    dVar16 = (aheight - (dVar15 + (aheight - dVar15))) + ((aheight - dVar15) - eheight);
    dVar31 = (dVar18 - (dVar43 + (dVar18 - dVar43))) + ((dVar18 - dVar43) - dVar54);
    dVar20 = (dVar17 - (dVar2 + (dVar17 - dVar2))) + ((dVar17 - dVar2) - dVar35);
    dVar47 = (dVar47 - (dVar22 + (dVar47 - dVar22))) + ((dVar47 - dVar22) - dVar12);
    dVar1 = (bheight - (dVar25 + (bheight - dVar25))) + ((bheight - dVar25) - eheight);
    dVar34 = (dVar34 - (dVar4 + (dVar34 - dVar4))) + ((dVar34 - dVar4) - dVar54);
    dVar17 = (dVar42 - (dVar3 + (dVar42 - dVar3))) + ((dVar42 - dVar3) - dVar35);
    dVar50 = (dVar50 - (dVar39 + (dVar50 - dVar39))) + ((dVar50 - dVar39) - dVar12);
    dVar18 = (cheight - (dVar45 + (cheight - dVar45))) + ((cheight - dVar45) - eheight);
    dVar54 = (dVar21 - (dVar26 + (dVar21 - dVar26))) + ((dVar21 - dVar26) - dVar54);
    dVar35 = (dVar53 - (dVar33 + (dVar53 - dVar33))) + ((dVar53 - dVar33) - dVar35);
    dVar42 = (dVar28 - (dVar14 + (dVar28 - dVar14))) + ((dVar28 - dVar14) - dVar12);
    dVar53 = (dheight - (dVar19 + (dheight - dVar19))) + ((dheight - dVar19) - eheight);
    if ((((((dVar53 != 0.0) || (((NAN(dVar53) || (dVar18 != 0.0)) || (NAN(dVar18))))) ||
          (((dVar1 != 0.0 || (NAN(dVar1))) || (dVar16 != 0.0)))) ||
         ((((NAN(dVar16) || (dVar27 != 0.0)) ||
           ((NAN(dVar27) ||
            (((((dVar32 != 0.0 || (NAN(dVar32))) || (dVar30 != 0.0)) ||
              ((NAN(dVar30) || (dVar31 != 0.0)))) || (NAN(dVar31))))))) ||
          ((dVar20 != 0.0 || (NAN(dVar20))))))) ||
        ((dVar47 != 0.0 ||
         (((((NAN(dVar47) || (dVar34 != 0.0)) || (NAN(dVar34))) ||
           (((dVar17 != 0.0 || (NAN(dVar17))) ||
            ((dVar50 != 0.0 || ((NAN(dVar50) || (dVar54 != 0.0)))))))) || (NAN(dVar54))))))) ||
       ((((dVar35 != 0.0 || (NAN(dVar35))) || (dVar42 != 0.0)) || (NAN(dVar42))))) {
      dVar21 = permanent * isperrboundC + ABS(local_c38[0]) * resulterrbound;
      dVar12 = (dVar36 * dVar20 + dVar27 * dVar2) - (dVar29 * dVar31 + dVar43 * dVar32);
      dVar28 = (dVar43 * dVar17 + dVar31 * dVar3) - (dVar2 * dVar34 + dVar4 * dVar20);
      dVar38 = (dVar4 * dVar35 + dVar34 * dVar33) - (dVar3 * dVar54 + dVar26 * dVar17);
      dVar37 = (dVar26 * dVar32 + dVar29 * dVar54) - (dVar33 * dVar27 + dVar36 * dVar35);
      dVar17 = (dVar36 * dVar17 + dVar27 * dVar3) - (dVar29 * dVar34 + dVar4 * dVar32);
      dVar54 = (dVar43 * dVar35 + dVar31 * dVar33) - (dVar2 * dVar54 + dVar26 * dVar20);
      local_c38[0] = ((dVar1 * (dVar13 * dVar41 + dVar39 * dVar52 + dVar14 * dVar24) +
                      dVar53 * (dVar39 * dVar40 + dVar13 * dVar46 + dVar24 * local_1588)) -
                     (dVar16 * (dVar46 * dVar14 + dVar41 * dVar22 + local_1578 * dVar23) +
                     dVar18 * (dVar22 * dVar52 + dVar14 * dVar40 + dVar13 * dVar23))) +
                     ((dVar25 * (dVar30 * dVar41 + dVar50 * dVar52 + dVar42 * dVar24 +
                                dVar13 * dVar38 + dVar39 * dVar37 + dVar14 * dVar17) +
                      dVar19 * (dVar50 * dVar40 + (dVar30 * dVar46 - dVar24 * dVar47) +
                               dVar39 * dVar12 + dVar13 * dVar28 + dVar17 * local_1588)) -
                     (dVar15 * (dVar42 * dVar46 + (dVar47 * dVar41 - dVar23 * dVar50) +
                               dVar28 * dVar14 + dVar38 * dVar22 + dVar54 * local_1578) +
                     dVar45 * (dVar47 * dVar52 + dVar42 * dVar40 + dVar30 * dVar23 +
                              dVar37 * dVar22 + dVar12 * dVar14 + dVar13 * dVar54))) + local_c38[0];
      if ((local_c38[0] < dVar21) && (-local_c38[0] < dVar21)) {
        dVar1 = orient4dexact(pa,pb,pc,pd,pe,aheight,bheight,cheight,dheight,eheight);
        return dVar1;
      }
    }
  }
  return local_c38[0];
}

Assistant:

REAL orient4dadapt(REAL* pa, REAL* pb, REAL* pc, REAL* pd, REAL* pe,
                   REAL aheight, REAL bheight, REAL cheight, REAL dheight, 
                   REAL eheight, REAL permanent)
{
  INEXACT REAL aex, bex, cex, dex, aey, bey, cey, dey, aez, bez, cez, dez;
  INEXACT REAL aeheight, beheight, ceheight, deheight;
  REAL det, errbound;

  INEXACT REAL aexbey1, bexaey1, bexcey1, cexbey1;
  INEXACT REAL cexdey1, dexcey1, dexaey1, aexdey1;
  INEXACT REAL aexcey1, cexaey1, bexdey1, dexbey1;
  REAL aexbey0, bexaey0, bexcey0, cexbey0;
  REAL cexdey0, dexcey0, dexaey0, aexdey0;
  REAL aexcey0, cexaey0, bexdey0, dexbey0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  INEXACT REAL ab3, bc3, cd3, da3, ac3, bd3;
  REAL abeps, bceps, cdeps, daeps, aceps, bdeps;
  REAL temp8a[8], temp8b[8], temp8c[8], temp16[16], temp24[24];
  int temp8alen, temp8blen, temp8clen, temp16len, temp24len;
  REAL adet[48], bdet[48], cdet[48], ddet[48];
  int alen, blen, clen, dlen;
  REAL abdet[96], cddet[96];
  int ablen, cdlen;
  REAL fin1[192];
  int finlength;

  REAL aextail, bextail, cextail, dextail;
  REAL aeytail, beytail, ceytail, deytail;
  REAL aeztail, beztail, ceztail, deztail;
  REAL aeheighttail, beheighttail, ceheighttail, deheighttail;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;


  aex = (REAL) (pa[0] - pe[0]);
  bex = (REAL) (pb[0] - pe[0]);
  cex = (REAL) (pc[0] - pe[0]);
  dex = (REAL) (pd[0] - pe[0]);
  aey = (REAL) (pa[1] - pe[1]);
  bey = (REAL) (pb[1] - pe[1]);
  cey = (REAL) (pc[1] - pe[1]);
  dey = (REAL) (pd[1] - pe[1]);
  aez = (REAL) (pa[2] - pe[2]);
  bez = (REAL) (pb[2] - pe[2]);
  cez = (REAL) (pc[2] - pe[2]);
  dez = (REAL) (pd[2] - pe[2]);
  aeheight = (REAL) (aheight - eheight);
  beheight = (REAL) (bheight - eheight);
  ceheight = (REAL) (cheight - eheight);
  deheight = (REAL) (dheight - eheight);

  Two_Product(aex, bey, aexbey1, aexbey0);
  Two_Product(bex, aey, bexaey1, bexaey0);
  Two_Two_Diff(aexbey1, aexbey0, bexaey1, bexaey0, ab3, ab[2], ab[1], ab[0]);
  ab[3] = ab3;

  Two_Product(bex, cey, bexcey1, bexcey0);
  Two_Product(cex, bey, cexbey1, cexbey0);
  Two_Two_Diff(bexcey1, bexcey0, cexbey1, cexbey0, bc3, bc[2], bc[1], bc[0]);
  bc[3] = bc3;

  Two_Product(cex, dey, cexdey1, cexdey0);
  Two_Product(dex, cey, dexcey1, dexcey0);
  Two_Two_Diff(cexdey1, cexdey0, dexcey1, dexcey0, cd3, cd[2], cd[1], cd[0]);
  cd[3] = cd3;

  Two_Product(dex, aey, dexaey1, dexaey0);
  Two_Product(aex, dey, aexdey1, aexdey0);
  Two_Two_Diff(dexaey1, dexaey0, aexdey1, aexdey0, da3, da[2], da[1], da[0]);
  da[3] = da3;

  Two_Product(aex, cey, aexcey1, aexcey0);
  Two_Product(cex, aey, cexaey1, cexaey0);
  Two_Two_Diff(aexcey1, aexcey0, cexaey1, cexaey0, ac3, ac[2], ac[1], ac[0]);
  ac[3] = ac3;

  Two_Product(bex, dey, bexdey1, bexdey0);
  Two_Product(dex, bey, dexbey1, dexbey0);
  Two_Two_Diff(bexdey1, bexdey0, dexbey1, dexbey0, bd3, bd[2], bd[1], bd[0]);
  bd[3] = bd3;

  temp8alen = scale_expansion_zeroelim(4, cd, bez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, -cez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, bc, dez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  alen = scale_expansion_zeroelim(temp24len, temp24, -aeheight, adet);

  temp8alen = scale_expansion_zeroelim(4, da, cez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, dez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, cd, aez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  blen = scale_expansion_zeroelim(temp24len, temp24, beheight, bdet);

  temp8alen = scale_expansion_zeroelim(4, ab, dez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, aez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, da, bez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  clen = scale_expansion_zeroelim(temp24len, temp24, -ceheight, cdet);

  temp8alen = scale_expansion_zeroelim(4, bc, aez, temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, -bez, temp8b);
  temp8clen = scale_expansion_zeroelim(4, ab, cez, temp8c);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a,
                                          temp8blen, temp8b, temp16);
  temp24len = fast_expansion_sum_zeroelim(temp8clen, temp8c,
                                          temp16len, temp16, temp24);
  dlen = scale_expansion_zeroelim(temp24len, temp24, deheight, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  finlength = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, fin1);

  det = estimate(finlength, fin1);
  errbound = isperrboundB * permanent;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Diff_Tail(pa[0], pe[0], aex, aextail);
  Two_Diff_Tail(pa[1], pe[1], aey, aeytail);
  Two_Diff_Tail(pa[2], pe[2], aez, aeztail);
  Two_Diff_Tail(aheight, eheight, aeheight, aeheighttail);
  Two_Diff_Tail(pb[0], pe[0], bex, bextail);
  Two_Diff_Tail(pb[1], pe[1], bey, beytail);
  Two_Diff_Tail(pb[2], pe[2], bez, beztail);
  Two_Diff_Tail(bheight, eheight, beheight, beheighttail);
  Two_Diff_Tail(pc[0], pe[0], cex, cextail);
  Two_Diff_Tail(pc[1], pe[1], cey, ceytail);
  Two_Diff_Tail(pc[2], pe[2], cez, ceztail);
  Two_Diff_Tail(cheight, eheight, ceheight, ceheighttail);
  Two_Diff_Tail(pd[0], pe[0], dex, dextail);
  Two_Diff_Tail(pd[1], pe[1], dey, deytail);
  Two_Diff_Tail(pd[2], pe[2], dez, deztail);
  Two_Diff_Tail(dheight, eheight, deheight, deheighttail);
  if ((aextail == 0.0) && (aeytail == 0.0) && (aeztail == 0.0)
      && (bextail == 0.0) && (beytail == 0.0) && (beztail == 0.0)
      && (cextail == 0.0) && (ceytail == 0.0) && (ceztail == 0.0)
      && (dextail == 0.0) && (deytail == 0.0) && (deztail == 0.0)
      && (aeheighttail == 0.0) && (beheighttail == 0.0)
      && (ceheighttail == 0.0) && (deheighttail == 0.0)) {
    return det;
  }

  errbound = isperrboundC * permanent + resulterrbound * Absolute(det);
  abeps = (aex * beytail + bey * aextail)
        - (aey * bextail + bex * aeytail);
  bceps = (bex * ceytail + cey * bextail)
        - (bey * cextail + cex * beytail);
  cdeps = (cex * deytail + dey * cextail)
        - (cey * dextail + dex * ceytail);
  daeps = (dex * aeytail + aey * dextail)
        - (dey * aextail + aex * deytail);
  aceps = (aex * ceytail + cey * aextail)
        - (aey * cextail + cex * aeytail);
  bdeps = (bex * deytail + dey * bextail)
        - (bey * dextail + dex * beytail);
  det += ((beheight
           * ((cez * daeps + dez * aceps + aez * cdeps)
              + (ceztail * da3 + deztail * ac3 + aeztail * cd3))
           + deheight
           * ((aez * bceps - bez * aceps + cez * abeps)
              + (aeztail * bc3 - beztail * ac3 + ceztail * ab3)))
          - (aeheight
           * ((bez * cdeps - cez * bdeps + dez * bceps)
              + (beztail * cd3 - ceztail * bd3 + deztail * bc3))
           + ceheight
           * ((dez * abeps + aez * bdeps + bez * daeps)
              + (deztail * ab3 + aeztail * bd3 + beztail * da3))))
       + ((beheighttail * (cez * da3 + dez * ac3 + aez * cd3)
           + deheighttail * (aez * bc3 - bez * ac3 + cez * ab3))
          - (aeheighttail * (bez * cd3 - cez * bd3 + dez * bc3)
           + ceheighttail * (dez * ab3 + aez * bd3 + bez * da3)));
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  return orient4dexact(pa, pb, pc, pd, pe,
                       aheight, bheight, cheight, dheight, eheight);
}